

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::eval_divide_knuth
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,
          uintwide_t<256U,_unsigned_int,_void,_true> *other,
          uintwide_t<256U,_unsigned_int,_void,_true> *remainder)

{
  value_type_conflict vVar1;
  value_type_conflict vVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  unsigned_fast_type v_offset;
  unsigned_fast_type u_offset;
  
  lVar8 = 0x20;
  u_offset = 0;
  do {
    if (*(int *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar8 + -4) != 0)
    goto LAB_0013a376;
    u_offset = u_offset + 1;
    lVar8 = lVar8 + -4;
  } while (lVar8 != 0);
  u_offset = 8;
LAB_0013a376:
  lVar8 = 0x20;
  v_offset = 0;
  while (*(int *)((long)(other->values).super_array<unsigned_int,_8UL>.elems + lVar8 + -4) == 0) {
    v_offset = v_offset + 1;
    lVar8 = lVar8 + -4;
    if (lVar8 == 0) goto LAB_0013a3d3;
  }
  if (lVar8 == 0) goto LAB_0013a3d3;
  if (u_offset == 8) goto joined_r0x0013a3ea;
  vVar1 = (other->values).super_array<unsigned_int,_8UL>.elems[7];
  vVar2 = (this->values).super_array<unsigned_int,_8UL>.elems[7];
  if (-1 < (int)vVar1 && (int)vVar2 < 0) goto LAB_0013a3b3;
  if ((int)vVar1 < 0 && -1 < (int)vVar2) goto LAB_0013a42b;
  lVar8 = 0x1c;
  while (lVar8 != -4) {
    uVar3 = *(uint *)((long)(other->values).super_array<unsigned_int,_8UL>.elems + lVar8);
    uVar4 = *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar8);
    lVar8 = lVar8 + -4;
    if (uVar4 != uVar3) {
      if (uVar4 <= uVar3) {
LAB_0013a3b3:
        if (remainder != (uintwide_t<256U,_unsigned_int,_void,_true> *)0x0) {
          uVar5 = *(undefined8 *)(this->values).super_array<unsigned_int,_8UL>.elems;
          uVar6 = *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 2);
          uVar7 = *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 6);
          *(undefined8 *)((remainder->values).super_array<unsigned_int,_8UL>.elems + 4) =
               *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 4);
          *(undefined8 *)((remainder->values).super_array<unsigned_int,_8UL>.elems + 6) = uVar7;
          *(undefined8 *)(remainder->values).super_array<unsigned_int,_8UL>.elems = uVar5;
          *(undefined8 *)((remainder->values).super_array<unsigned_int,_8UL>.elems + 2) = uVar6;
        }
        (this->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
        (this->values).super_array<unsigned_int,_8UL>.elems[5] = 0;
        (this->values).super_array<unsigned_int,_8UL>.elems[6] = 0;
        (this->values).super_array<unsigned_int,_8UL>.elems[7] = 0;
        (this->values).super_array<unsigned_int,_8UL>.elems[0] = 0;
        (this->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
        (this->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
        (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
        return;
      }
LAB_0013a42b:
      void_math::wide_integer::uintwide_t<256u,unsigned_int,void,true>::
      eval_divide_knuth_core<256u>(unsigned_long,unsigned_long,math::wide_integer::
      uintwide_t<256u,unsigned_int,void,true>const&,math::wide_integer::
      uintwide_t<256u,unsigned_int,void,true>*,std::enable_if<((256u)>(static_cast<unsigned_int>(std
      ::numeric_limits<unsigned_int>::digits))),int>::type__
                (this,u_offset,v_offset,other,remainder,
                 (enable_if_t<(256U_>_static_cast<size_t>_std__numeric_limits<limb_type>__digits____int>
                  *)0x0);
      return;
    }
  }
  (this->values).super_array<unsigned_int,_8UL>.elems[0] = 1;
  (this->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[5] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[6] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[7] = 0;
joined_r0x0013a3ea:
  if (remainder == (uintwide_t<256U,_unsigned_int,_void,_true> *)0x0) {
    return;
  }
  (remainder->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
  (remainder->values).super_array<unsigned_int,_8UL>.elems[5] = 0;
  (remainder->values).super_array<unsigned_int,_8UL>.elems[6] = 0;
  (remainder->values).super_array<unsigned_int,_8UL>.elems[7] = 0;
  (remainder->values).super_array<unsigned_int,_8UL>.elems[0] = 0;
  (remainder->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
  (remainder->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
  (remainder->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
  return;
LAB_0013a3d3:
  (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[4] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[5] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[6] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[0] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[1] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[2] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0xffffffff;
  (this->values).super_array<unsigned_int,_8UL>.elems[7] = 0x7fffffff;
  goto joined_r0x0013a3ea;
}

Assistant:

constexpr auto eval_divide_knuth(const uintwide_t& other, uintwide_t* remainder = nullptr) -> void
    {
      // Use Knuth's long division algorithm.
      // The loop-ordering of indices in Knuth's original
      // algorithm has been reversed due to the data format
      // used here. Several optimizations and combinations
      // of logic have been carried out in the source code.

      // See also:
      // D.E. Knuth, "The Art of Computer Programming, Volume 2:
      // Seminumerical Algorithms", Addison-Wesley (1998),
      // Section 4.3.1 Algorithm D and Exercise 16.

      using local_uint_index_type = unsigned_fast_type;

      local_uint_index_type u_offset { };
      local_uint_index_type v_offset { };

      auto crit_u =       values.crbegin();
      auto crit_v = other.values.crbegin();

      while(crit_u != values.crend() && (*crit_u == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_u;
        ++u_offset;
      }

      while(crit_v != other.values.crend() && (*crit_v == static_cast<limb_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++crit_v;
        ++v_offset;
      }

      if(v_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The denominator is zero. Set the maximum value and return.
        // This also catches (0 / 0) and sets the maximum value for it.
        static_cast<void>(operator=(limits_helper_max<IsSigned>())); // LCOV_EXCL_LINE

        if(remainder != nullptr) // LCOV_EXCL_LINE
        {
          detail::fill_unsafe(remainder->values.begin(), remainder->values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
      }
      else if(u_offset == static_cast<local_uint_index_type>(number_of_limbs))
      {
        // The numerator is zero. Do nothing and return.

        if(remainder != nullptr)
        {
          *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
        }
      }
      else
      {
        const auto result_of_compare_left_with_right = compare(other);

        const auto left_is_less_than_right = (result_of_compare_left_with_right == INT8_C(-1));
        const auto left_is_equal_to_right  = (result_of_compare_left_with_right == INT8_C( 0));

        if(left_is_less_than_right)
        {
          // If the denominator is larger than the numerator,
          // then the result of the division is zero.
          if(remainder != nullptr)
          {
            *remainder = *this;
          }

          operator=(static_cast<std::uint8_t>(UINT8_C(0)));
        }
        else if(left_is_equal_to_right)
        {
          // If the denominator is equal to the numerator,
          // then the result of the division is one.
          operator=(static_cast<std::uint8_t>(UINT8_C(1)));

          if(remainder != nullptr)
          {
            *remainder = uintwide_t(static_cast<std::uint8_t>(UINT8_C(0)));
          }
        }
        else
        {
          eval_divide_knuth_core(u_offset, v_offset, other, remainder);
        }
      }
    }